

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  long lVar1;
  Curl_tree *in_RAX;
  Curl_tree *pCVar2;
  curltime cVar3;
  curltime newer;
  curltime older;
  
  if (multi->timetree == (Curl_tree *)0x0) {
    pCVar2 = (Curl_tree *)0xffffffffffffffff;
  }
  else {
    cVar3 = Curl_now();
    in_RAX = Curl_splay((curltime)ZEXT816(0),multi->timetree);
    multi->timetree = in_RAX;
    lVar1 = (in_RAX->key).tv_sec;
    pCVar2 = (Curl_tree *)0x0;
    if (cVar3.tv_sec <= lVar1) {
      if ((cVar3.tv_sec < lVar1) || (cVar3.tv_usec < (in_RAX->key).tv_usec)) {
        newer.tv_usec = (in_RAX->key).tv_usec;
        newer.tv_sec = lVar1;
        newer._12_4_ = 0;
        older._12_4_ = 0;
        older.tv_sec = SUB128(cVar3._0_12_,0);
        older.tv_usec = SUB124(cVar3._0_12_,8);
        in_RAX = (Curl_tree *)Curl_timediff(newer,older);
        pCVar2 = (Curl_tree *)0x1;
        if (1 < (long)in_RAX) {
          pCVar2 = in_RAX;
        }
      }
      else {
        pCVar2 = (Curl_tree *)0x0;
      }
    }
  }
  *timeout_ms = (long)pCVar2;
  return (CURLMcode)in_RAX;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static struct curltime tv_zero = {0, 0};

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff(multi->timetree->key, now);
      if(diff <= 0)
        /*
         * Since we only provide millisecond resolution on the returned value
         * and the diff might be less than one millisecond here, we don't
         * return zero as that may cause short bursts of busyloops on fast
         * processors while the diff is still present but less than one
         * millisecond! instead we return 1 until the time is ripe.
         */
        *timeout_ms = 1;
      else
        /* this should be safe even on 64 bit archs, as we don't use that
           overly long timeouts */
        *timeout_ms = (long)diff;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}